

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

uint8 * __thiscall
google::protobuf::ExtensionRangeOptions::InternalSerializeWithCachedSizesToArray
          (ExtensionRangeOptions *this,uint8 *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  uint32 uVar2;
  uint8 *target_00;
  uint8 *in_RDX;
  uint8 *in_RSI;
  ExtensionRangeOptions *in_RDI;
  uint n;
  uint i;
  uint32 cached_has_bits;
  uint8 **in_stack_ffffffffffffff58;
  uint local_90;
  uint8 *local_80;
  EpsCopyOutputStream *in_stack_ffffffffffffff98;
  EpsCopyOutputStream *in_stack_ffffffffffffffa0;
  UninterpretedOption *in_stack_ffffffffffffffa8;
  EpsCopyOutputStream *stream_00;
  uint8 *in_stack_ffffffffffffffb0;
  ExtensionSet *in_stack_ffffffffffffffb8;
  
  local_90 = 0;
  uVar1 = _internal_uninterpreted_option_size((ExtensionRangeOptions *)0x50fd25);
  local_80 = in_RSI;
  for (; local_90 < uVar1; local_90 = local_90 + 1) {
    io::EpsCopyOutputStream::EnsureSpace((EpsCopyOutputStream *)in_RDI,in_stack_ffffffffffffff58);
    _internal_uninterpreted_option(in_RDI,(int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
    in_stack_ffffffffffffffb0 = in_RDX;
    uVar2 = internal::WireFormatLite::MakeTag(999,WIRETYPE_LENGTH_DELIMITED);
    target_00 = io::CodedOutputStream::WriteVarint32ToArray(uVar2,local_80);
    uVar2 = UninterpretedOption::GetCachedSize((UninterpretedOption *)0x50fde4);
    in_stack_ffffffffffffffb8 =
         (ExtensionSet *)io::CodedOutputStream::WriteVarint32ToArray(uVar2,target_00);
    local_80 = UninterpretedOption::InternalSerializeWithCachedSizesToArray
                         (in_stack_ffffffffffffffa8,(uint8 *)in_stack_ffffffffffffffa0,
                          in_stack_ffffffffffffff98);
  }
  local_80 = internal::ExtensionSet::InternalSerializeWithCachedSizesToArray
                       (in_stack_ffffffffffffffb8,(int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                        (int)in_stack_ffffffffffffffb0,(uint8 *)in_stack_ffffffffffffffa8,
                        in_stack_ffffffffffffffa0);
  if (((uint)(in_RDI->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    stream_00 = (EpsCopyOutputStream *)&in_RDI->_internal_metadata_;
    if (((uint)(((InternalMetadataWithArena *)stream_00)->
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ).ptr_ & 1) == 1) {
      internal::
      InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
      ::
      PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                  *)stream_00);
    }
    else {
      internal::InternalMetadataWithArena::default_instance();
    }
    local_80 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                         ((UnknownFieldSet *)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                          stream_00);
  }
  return local_80;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* ExtensionRangeOptions::InternalSerializeWithCachedSizesToArray(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.ExtensionRangeOptions)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_uninterpreted_option_size()); i < n; i++) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(999, this->_internal_uninterpreted_option(i), target, stream);
  }

  // Extension range [1000, 536870912)
  target = _extensions_.InternalSerializeWithCachedSizesToArray(
      1000, 536870912, target, stream);

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields(), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.ExtensionRangeOptions)
  return target;
}